

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSupp.c
# Opt level: O2

int Sim_ComputeSuppRound(Sim_Man_t *p,int fUseTargets)

{
  void *pvVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  abctime aVar5;
  abctime aVar6;
  Abc_Obj_t *pAVar7;
  Vec_Vec_t *p_00;
  Vec_Ptr_t *pVVar8;
  Sim_Pat_t *Entry;
  uint uVar9;
  int i;
  int iVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  
  aVar5 = Abc_Clock();
  iVar14 = 0;
  Sim_UtilSimulate(p,0);
  aVar6 = Abc_Clock();
  p->timeSim = p->timeSim + (aVar6 - aVar5);
  lVar11 = (long)p->iInput;
  do {
    if (p->nInputs <= lVar11) {
      return iVar14;
    }
    if ((fUseTargets == 0) || (*(int *)((long)p->vSuppTargs->pArray[lVar11] + 4) != 0)) {
      aVar5 = Abc_Clock();
      iVar10 = (int)lVar11;
      pAVar7 = Abc_NtkCi(p->pNtk,iVar10);
      p_00 = Abc_DfsLevelized(pAVar7,0);
      aVar6 = Abc_Clock();
      p->timeTrav = p->timeTrav + (aVar6 - aVar5);
      Sim_UtilInfoFlip(p,pAVar7);
      for (iVar15 = 0; iVar15 < p_00->nSize; iVar15 = iVar15 + 1) {
        for (iVar13 = 0; pVVar8 = Vec_VecEntry(p_00,iVar15), iVar13 < pVVar8->nSize;
            iVar13 = iVar13 + 1) {
          pVVar8 = Vec_VecEntry(p_00,iVar15);
          pAVar7 = (Abc_Obj_t *)Vec_PtrEntry(pVVar8,iVar13);
          iVar3 = Abc_NodeIsTravIdCurrent
                            ((Abc_Obj_t *)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanins).pArray]);
          iVar4 = Abc_NodeIsTravIdCurrent
                            ((Abc_Obj_t *)pAVar7->pNtk->vObjs->pArray[(pAVar7->vFanins).pArray[1]]);
          aVar5 = Abc_Clock();
          Sim_UtilSimulateNode(p,pAVar7,1,iVar3,iVar4);
          aVar6 = Abc_Clock();
          p->timeSim = p->timeSim + (aVar6 - aVar5);
        }
      }
      iVar15 = iVar10 >> 5;
      if (fUseTargets != 0) {
        pVVar8 = (Vec_Ptr_t *)p->vSuppTargs->pArray[lVar11];
        uVar16 = (ulong)(uint)pVVar8->nSize;
        uVar9 = 1 << ((byte)lVar11 & 0x1f);
        iVar13 = 0;
        bVar2 = false;
LAB_004073b7:
        do {
          if ((int)uVar16 < 1) goto LAB_0040754e;
          iVar4 = (int)pVVar8->pArray[uVar16 - 1];
          pAVar7 = Abc_NtkCo(p->pNtk,iVar4);
          pAVar7 = (Abc_Obj_t *)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanins).pArray];
          iVar3 = Abc_NodeIsTravIdCurrent(pAVar7);
          if (iVar3 == 0) {
            __assert_fail("Abc_NodeIsTravIdCurrent(pNode)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sim/simSupp.c"
                          ,0xf3,"int Sim_ComputeSuppRoundNode(Sim_Man_t *, int, int)");
          }
          iVar3 = Sim_UtilInfoCompare(p,pAVar7);
          uVar16 = uVar16 - 1;
          if (iVar3 == 0) {
            Vec_PtrRemove(pVVar8,pVVar8->pArray[uVar16]);
            pvVar1 = p->vSuppFun->pArray[iVar4];
            uVar17 = *(uint *)((long)pvVar1 + (long)iVar15 * 4);
            if ((uVar17 & uVar9) != 0) {
              __assert_fail("!Sim_SuppFunHasVar(p->vSuppFun, Output, iNumCi)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sim/simSupp.c"
                            ,0xff,"int Sim_ComputeSuppRoundNode(Sim_Man_t *, int, int)");
            }
            iVar13 = iVar13 + 1;
            *(uint *)((long)pvVar1 + (long)iVar15 * 4) = uVar17 | uVar9;
            Sim_UtilInfoDetectDiffs
                      ((uint *)p->vSim0->pArray[pAVar7->Id],(uint *)p->vSim1->pArray[pAVar7->Id],
                       p->nSimWords,p->vDiffs);
            if ((!bVar2) || (p->vFifo->nSize < 0x3e9)) {
              if (p->vDiffs->nSize < 1) goto LAB_004073b7;
              iVar3 = Vec_IntEntry(p->vDiffs,0);
              Entry = Sim_ManPatAlloc(p);
              Entry->Input = iVar10;
              Entry->Output = iVar4;
              for (uVar17 = 0; (int)uVar17 < p->pNtk->vCis->nSize; uVar17 = uVar17 + 1) {
                pAVar7 = Abc_NtkCi(p->pNtk,uVar17);
                if ((*(uint *)((long)p->vSim0->pArray[pAVar7->Id] + (long)(iVar3 >> 5) * 4) &
                    1 << ((byte)iVar3 & 0x1f)) != 0) {
                  Entry->pData[uVar17 >> 5] = Entry->pData[uVar17 >> 5] | 1 << ((byte)uVar17 & 0x1f)
                  ;
                }
              }
              Vec_PtrPush(p->vFifo,Entry);
            }
            bVar2 = true;
          }
        } while( true );
      }
      uVar9 = 1 << ((byte)lVar11 & 0x1f);
      iVar13 = 0;
      for (lVar12 = 0; lVar12 < p->pNtk->vCos->nSize; lVar12 = lVar12 + 1) {
        pAVar7 = Abc_NtkCo(p->pNtk,(int)lVar12);
        iVar10 = Abc_NodeIsTravIdCurrent(pAVar7);
        if ((iVar10 != 0) &&
           (iVar10 = Sim_UtilInfoCompare(p,(Abc_Obj_t *)
                                           pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanins).pArray]),
           iVar10 == 0)) {
          pvVar1 = p->vSuppFun->pArray[lVar12];
          uVar17 = *(uint *)((long)pvVar1 + (long)iVar15 * 4);
          if ((uVar17 & uVar9) == 0) {
            iVar13 = iVar13 + 1;
            *(uint *)((long)pvVar1 + (long)iVar15 * 4) = uVar17 | uVar9;
          }
        }
      }
LAB_0040754e:
      for (iVar10 = 0; iVar10 < p_00->nSize; iVar10 = iVar10 + 1) {
        pVVar8 = Vec_VecEntry(p_00,iVar10);
        if (pVVar8 != (Vec_Ptr_t *)0x0) {
          Vec_PtrFree(pVVar8);
        }
      }
      Vec_PtrFree((Vec_Ptr_t *)p_00);
      iVar14 = iVar14 + iVar13;
    }
    lVar11 = lVar11 + 1;
  } while( true );
}

Assistant:

int Sim_ComputeSuppRound( Sim_Man_t * p, int  fUseTargets )
{
    Vec_Ptr_t * vTargets;
    int i, Counter = 0;
    abctime clk;
    // perform one round of random simulation
clk = Abc_Clock();
    Sim_UtilSimulate( p, 0 );
p->timeSim += Abc_Clock() - clk;
    // iterate through the CIs and detect COs that depend on them
    for ( i = p->iInput; i < p->nInputs; i++ )
    {
        vTargets = (Vec_Ptr_t *)p->vSuppTargs->pArray[i];
        if ( fUseTargets && vTargets->nSize == 0 )
            continue;
        Counter += Sim_ComputeSuppRoundNode( p, i, fUseTargets );
    }
    return Counter;
}